

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

int arenas_create_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                     size_t newlen)

{
  uint ind;
  ulong uVar1;
  ctl_arenas_t *pcVar2;
  int iVar3;
  undefined8 in_RAX;
  ctl_arena_t *pcVar4;
  ctl_arena_t *pcVar5;
  arena_t *paVar6;
  size_t __n;
  uint uVar7;
  extent_hooks_t *extent_hooks;
  uint arena_ind;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  iVar3 = pthread_mutex_trylock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x40));
  if (iVar3 != 0) {
    malloc_mutex_lock_slow(&ctl_mtx);
    ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  pcVar2 = ctl_arenas;
  ctl_mtx.field_0.field_0.prof_data.n_lock_ops = ctl_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(ctl_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    ctl_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(ctl_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    ctl_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  if (newp == (void *)0x0) {
    extent_hooks = &extent_hooks_default;
  }
  else {
    iVar3 = 0x16;
    if (newlen != 8) goto LAB_001215fb;
    extent_hooks = *newp;
  }
  pcVar5 = (ctl_arenas->destroyed).qlh_first;
  if (pcVar5 == (ctl_arena_t *)0x0) {
    pcVar4 = (ctl_arena_t *)0x0;
  }
  else {
    pcVar4 = (pcVar5->destroyed_link).qre_prev;
  }
  if (pcVar4 == (ctl_arena_t *)0x0) {
    pcVar4 = (ctl_arena_t *)&ctl_arenas->narenas;
  }
  else {
    if (pcVar5 == pcVar4) {
      (ctl_arenas->destroyed).qlh_first = (pcVar5->destroyed_link).qre_next;
    }
    if ((pcVar2->destroyed).qlh_first == pcVar4) {
      (pcVar2->destroyed).qlh_first = (ctl_arena_t *)0x0;
    }
    else {
      pcVar5 = (pcVar4->destroyed_link).qre_prev;
      (pcVar5->destroyed_link).qre_next = (pcVar4->destroyed_link).qre_next;
      (((pcVar4->destroyed_link).qre_next)->destroyed_link).qre_prev = pcVar5;
      (pcVar4->destroyed_link).qre_next = pcVar4;
      (pcVar4->destroyed_link).qre_prev = pcVar4;
    }
  }
  ind = pcVar4->arena_ind;
  pcVar5 = arenas_i_impl(tsd,(ulong)ind,false,true);
  uVar7 = 0xffffffff;
  if (((pcVar5 != (ctl_arena_t *)0x0) &&
      (paVar6 = arena_init((tsdn_t *)tsd,ind,extent_hooks), paVar6 != (arena_t *)0x0)) &&
     (uVar7 = ind, ind == ctl_arenas->narenas)) {
    ctl_arenas->narenas = ctl_arenas->narenas + 1;
  }
  uStack_38 = CONCAT44(uVar7,(undefined4)uStack_38);
  if (uVar7 == 0xffffffff) {
    iVar3 = 0xb;
  }
  else {
    iVar3 = 0;
    if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
      uVar1 = *oldlenp;
      if (uVar1 == 4) {
        *(uint *)oldp = uVar7;
        iVar3 = 0;
      }
      else {
        __n = 4;
        if (uVar1 < 4) {
          __n = uVar1;
        }
        memcpy(oldp,(void *)((long)&uStack_38 + 4),__n);
        iVar3 = 0x16;
      }
    }
  }
LAB_001215fb:
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x40));
  return iVar3;
}

Assistant:

static int
arenas_create_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	extent_hooks_t *extent_hooks;
	unsigned arena_ind;

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);

	extent_hooks = (extent_hooks_t *)&extent_hooks_default;
	WRITE(extent_hooks, extent_hooks_t *);
	if ((arena_ind = ctl_arena_init(tsd, extent_hooks)) == UINT_MAX) {
		ret = EAGAIN;
		goto label_return;
	}
	READ(arena_ind, unsigned);

	ret = 0;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}